

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

void aom_get_var_sse_sum_8x8_quad_c
               (uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse8x8,int *sum8x8,
               uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  int iVar14;
  int k;
  long lVar15;
  int i;
  int iVar16;
  long lVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint32_t uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  short sVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  
  lVar15 = 0;
  do {
    puVar18 = a + lVar15 * 8;
    puVar19 = b + lVar15 * 8;
    uVar24 = 0;
    iVar20 = 0;
    iVar16 = 0;
    do {
      iVar25 = 0;
      iVar26 = 0;
      iVar27 = 0;
      iVar21 = 0;
      iVar22 = 0;
      iVar23 = 0;
      lVar17 = 0;
      do {
        uVar1 = *(undefined4 *)(puVar18 + lVar17);
        uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar2._8_4_ = 0;
        auVar2._0_8_ = uVar8;
        auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar3[8] = (char)((uint)uVar1 >> 0x10);
        auVar3._0_8_ = uVar8;
        auVar3[9] = 0;
        auVar3._10_3_ = auVar2._10_3_;
        auVar10._5_8_ = 0;
        auVar10._0_5_ = auVar3._8_5_;
        auVar4[4] = (char)((uint)uVar1 >> 8);
        auVar4._0_4_ = (int)uVar8;
        auVar4[5] = 0;
        auVar4._6_7_ = SUB137(auVar10 << 0x40,6);
        uVar1 = *(undefined4 *)(puVar19 + lVar17);
        uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar9;
        auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar6[8] = (char)((uint)uVar1 >> 0x10);
        auVar6._0_8_ = uVar9;
        auVar6[9] = 0;
        auVar6._10_3_ = auVar5._10_3_;
        auVar11._5_8_ = 0;
        auVar11._0_5_ = auVar6._8_5_;
        auVar7[4] = (char)((uint)uVar1 >> 8);
        auVar7._0_4_ = (int)uVar9;
        auVar7[5] = 0;
        auVar7._6_7_ = SUB137(auVar11 << 0x40,6);
        auVar28._0_4_ = (int)uVar8 - (int)uVar9;
        auVar28._4_4_ = auVar4._4_4_ - auVar7._4_4_;
        auVar28._8_4_ = auVar3._8_4_ - auVar6._8_4_;
        auVar28._12_4_ = (uint)(uint3)(auVar2._10_3_ >> 0x10) - (uint)(uint3)(auVar5._10_3_ >> 0x10)
        ;
        iVar20 = iVar20 + auVar28._0_4_;
        iVar21 = iVar21 + auVar28._4_4_;
        iVar22 = iVar22 + auVar28._8_4_;
        iVar23 = iVar23 + auVar28._12_4_;
        auVar28 = packssdw(auVar28,auVar28);
        auVar30 = pmulhw(auVar28,auVar28);
        sVar29 = auVar28._6_2_ * auVar28._6_2_;
        iVar14 = CONCAT22(auVar30._6_2_,sVar29);
        Var13 = CONCAT64(CONCAT42(iVar14,auVar30._4_2_),
                         CONCAT22(auVar28._4_2_ * auVar28._4_2_,sVar29));
        auVar12._4_8_ = (long)((unkuint10)Var13 >> 0x10);
        auVar12._2_2_ = auVar30._2_2_;
        auVar12._0_2_ = auVar28._2_2_ * auVar28._2_2_;
        uVar24 = uVar24 + CONCAT22(auVar30._0_2_,auVar28._0_2_ * auVar28._0_2_);
        iVar25 = iVar25 + auVar12._0_4_;
        iVar26 = iVar26 + (int)((unkuint10)Var13 >> 0x10);
        iVar27 = iVar27 + iVar14;
        lVar17 = lVar17 + 4;
      } while (lVar17 != 8);
      uVar24 = iVar27 + iVar25 + iVar26 + uVar24;
      iVar20 = iVar23 + iVar21 + iVar22 + iVar20;
      puVar18 = puVar18 + a_stride;
      puVar19 = puVar19 + b_stride;
      iVar16 = iVar16 + 1;
    } while (iVar16 != 8);
    sum8x8[lVar15] = iVar20;
    sse8x8[lVar15] = uVar24;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  *tot_sse = *tot_sse + sse8x8[3] + sse8x8[1] + sse8x8[2] + *sse8x8;
  *tot_sum = *tot_sum + sum8x8[3] + sum8x8[1] + sum8x8[2] + *sum8x8;
  lVar15 = 0;
  do {
    var8x8[lVar15] =
         sse8x8[lVar15] - (int)((ulong)((long)sum8x8[lVar15] * (long)sum8x8[lVar15]) >> 6);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  return;
}

Assistant:

void aom_get_var_sse_sum_8x8_quad_c(const uint8_t *a, int a_stride,
                                    const uint8_t *b, int b_stride,
                                    uint32_t *sse8x8, int *sum8x8,
                                    unsigned int *tot_sse, int *tot_sum,
                                    uint32_t *var8x8) {
  // Loop over 4 8x8 blocks. Process one 8x32 block.
  for (int k = 0; k < 4; k++) {
    variance(a + (k * 8), a_stride, b + (k * 8), b_stride, 8, 8, &sse8x8[k],
             &sum8x8[k]);
  }

  // Calculate variance at 8x8 level and total sse, sum of 8x32 block.
  *tot_sse += sse8x8[0] + sse8x8[1] + sse8x8[2] + sse8x8[3];
  *tot_sum += sum8x8[0] + sum8x8[1] + sum8x8[2] + sum8x8[3];
  for (int i = 0; i < 4; i++)
    var8x8[i] = sse8x8[i] - (uint32_t)(((int64_t)sum8x8[i] * sum8x8[i]) >> 6);
}